

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

timediff_t Curl_shutdown_timeleft(connectdata *conn,int sockindex,curltime *nowp)

{
  uint uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int *piVar4;
  timediff_t tVar5;
  long lVar6;
  curltime *pcVar7;
  curltime older;
  curltime cVar8;
  int local_20 [2];
  time_t local_18;
  
  if ((conn->shutdown).start[sockindex].tv_sec != 0) {
    if ((conn->shutdown).timeout_ms == 0) {
      tVar5 = 0;
    }
    else {
      pcVar7 = (conn->shutdown).start + sockindex;
      if (nowp == (curltime *)0x0) {
        cVar8 = Curl_now();
        nowp = (curltime *)&local_18;
        local_18 = cVar8.tv_sec;
        piVar4 = local_20;
        local_20[0] = cVar8.tv_usec;
      }
      else {
        piVar4 = &nowp->tv_usec;
      }
      uVar1 = (conn->shutdown).timeout_ms;
      uVar2 = pcVar7->tv_sec;
      uVar3 = pcVar7->tv_usec;
      older.tv_usec = uVar3;
      older.tv_sec = uVar2;
      cVar8.tv_usec = *piVar4;
      cVar8.tv_sec = nowp->tv_sec;
      cVar8._12_4_ = 0;
      older._12_4_ = 0;
      tVar5 = Curl_timediff(cVar8,older);
      lVar6 = (ulong)uVar1 - tVar5;
      tVar5 = -1;
      if (lVar6 != 0) {
        tVar5 = lVar6;
      }
    }
    return tVar5;
  }
  return 0;
}

Assistant:

timediff_t Curl_shutdown_timeleft(struct connectdata *conn, int sockindex,
                                  struct curltime *nowp)
{
  struct curltime now;
  timediff_t left_ms;

  if(!conn->shutdown.start[sockindex].tv_sec || !conn->shutdown.timeout_ms)
    return 0; /* not started or no limits */

  if(!nowp) {
    now = Curl_now();
    nowp = &now;
  }
  left_ms = conn->shutdown.timeout_ms -
            Curl_timediff(*nowp, conn->shutdown.start[sockindex]);
  return left_ms ? left_ms : -1;
}